

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O3

bool __thiscall
Lib::FlatteningIterator<Kernel::LookaheadLiteralSelector::GenIteratorIterator>::hasNext
          (FlatteningIterator<Kernel::LookaheadLiteralSelector::GenIteratorIterator> *this)

{
  long *plVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  Value unaff_R15;
  OptionBase<Lib::VirtualIterator<std::tuple<>_>_> local_48;
  Value local_38;
  
  if ((this->_current).super_OptionBase<Lib::VirtualIterator<std::tuple<>_>_>._isSome == true) {
    do {
      cVar2 = (**(code **)(*(long *)(this->_current).
                                    super_OptionBase<Lib::VirtualIterator<std::tuple<>_>_>._elem.
                                    _elem + 0x10))();
      if (cVar2 != '\0') {
        return (bool)cVar2;
      }
      bVar3 = Kernel::LookaheadLiteralSelector::GenIteratorIterator::hasNext(&this->_master);
      if (bVar3) {
        Kernel::LookaheadLiteralSelector::GenIteratorIterator::next
                  ((GenIteratorIterator *)&local_38.init);
        unaff_R15 = local_38;
        if (local_38 == (Value)0x0) {
          local_48._isSome = true;
          local_48._elem._elem = (Value)0x0;
          unaff_R15 = (Value)0x0;
        }
        else {
          local_48._isSome = true;
          local_48._elem._elem = local_38;
          iVar4 = *(int *)((long)local_38 + 8) + 2;
          *(int *)((long)local_38 + 8) = iVar4;
          if (iVar4 == 0) {
            (**(code **)(*(long *)local_38 + 8))(local_38);
          }
        }
      }
      else {
        local_48._isSome = false;
        local_48._1_7_ = 0;
        local_48._elem._elem = (Value)0x0;
      }
      OptionBase<Lib::VirtualIterator<std::tuple<>_>_>::operator=
                (&(this->_current).super_OptionBase<Lib::VirtualIterator<std::tuple<>_>_>,&local_48)
      ;
      if ((local_48._isSome == true) && (local_48._elem._elem != (Value)0x0)) {
        plVar1 = (long *)((long)local_48._elem._elem + 8);
        *(int *)plVar1 = *(int *)plVar1 + -1;
        if (*(int *)plVar1 == 0) {
          (**(code **)(*(long *)local_48._elem._elem + 8))();
        }
      }
      if (bVar3) {
        if (unaff_R15 != (Value)0x0) {
          plVar1 = (long *)((long)unaff_R15 + 8);
          *(int *)plVar1 = *(int *)plVar1 + -1;
          if (*(int *)plVar1 == 0) {
            (**(code **)(*(long *)unaff_R15 + 8))(unaff_R15);
          }
        }
        if (local_38 != (Value)0x0) {
          plVar1 = (long *)((long)local_38 + 8);
          *(int *)plVar1 = *(int *)plVar1 + -1;
          if (*(int *)plVar1 == 0) {
            (**(code **)(*(long *)local_38 + 8))();
          }
        }
      }
    } while ((this->_current).super_OptionBase<Lib::VirtualIterator<std::tuple<>_>_>._isSome !=
             false);
  }
  return false;
}

Assistant:

bool hasNext()
  {
    while (_current.isSome()) {
      if (_current->hasNext()) {
        return true;
      } else {
        _current = _master.hasNext() 
          ? Option<Inner>(move_if_value<Inner>(_master.next())) 
          : Option<Inner>();
      }
    }
    return false;
  }